

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall correctness_sub_signed_Test::TestBody(correctness_sub_signed_Test *this)

{
  bool bVar1;
  internal iVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  big_integer a;
  big_integer b;
  AssertHelper AStack_138;
  Message local_130;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  undefined1 local_120 [56];
  undefined1 local_e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0 [6];
  big_integer local_b0;
  big_integer local_78;
  big_integer local_40;
  
  big_integer::big_integer(&local_b0,5);
  big_integer::big_integer(&local_78,0x14);
  big_integer::big_integer(&local_40,&local_b0);
  operator-((big_integer *)local_120,&local_40,&local_78);
  big_integer::big_integer((big_integer *)local_e8,-0xf);
  local_130.ss_.ptr_._0_1_ = (internal)operator==((big_integer *)local_120,(big_integer *)local_e8);
  local_128.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  big_integer::~big_integer((big_integer *)local_e8);
  big_integer::~big_integer((big_integer *)local_120);
  big_integer::~big_integer(&local_40);
  if (local_130.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_120,(internal *)&local_130,(AssertionResult *)"a - b == -15","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x9d,(char *)local_120._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_138,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if (CONCAT71(local_e8._1_7_,local_e8[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_e8._1_7_,local_e8[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_e8._1_7_,local_e8[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_128,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::operator-=(&local_b0,&local_78);
  big_integer::big_integer((big_integer *)local_120,-0xf);
  local_e8[0] = (internal)operator==(&local_b0,(big_integer *)local_120);
  local_e0[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  big_integer::~big_integer((big_integer *)local_120);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_120,(internal *)local_e8,(AssertionResult *)"a == -15","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0xa0,(char *)local_120._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if (CONCAT71(local_130.ss_.ptr_._1_7_,local_130.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_130.ss_.ptr_._1_7_,local_130.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_130.ss_.ptr_._1_7_,local_130.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::big_integer((big_integer *)local_120,-100);
  big_integer::operator-=(&local_b0,(big_integer *)local_120);
  big_integer::~big_integer((big_integer *)local_120);
  big_integer::big_integer((big_integer *)local_120,0x55);
  iVar2 = (internal)operator==(&local_b0,(big_integer *)local_120);
  local_e0[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8[0] = iVar2;
  big_integer::~big_integer((big_integer *)local_120);
  if (!(bool)iVar2) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_120,(internal *)local_e8,(AssertionResult *)"a == 85","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0xa3,(char *)local_120._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if (CONCAT71(local_130.ss_.ptr_._1_7_,local_130.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_130.ss_.ptr_._1_7_,local_130.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_130.ss_.ptr_._1_7_,local_130.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_78);
  big_integer::~big_integer(&local_b0);
  return;
}

Assistant:

TEST(correctness, sub_signed)
{
    big_integer a = 5;
    big_integer b = 20;

    EXPECT_TRUE(a - b == -15);

    a -= b;
    EXPECT_TRUE(a == -15);

    a -= -100;
    EXPECT_TRUE(a == 85);
}